

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O2

void Cec_SetActivityFactors_rec(Cec_ManSat_t *p,Gia_Obj_t *pObj,int LevelMin,int LevelMax)

{
  sat_solver *psVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  
  while( true ) {
    iVar2 = Gia_ObjIsTravIdCurrent(p->pAig,pObj);
    if (iVar2 != 0) {
      return;
    }
    Gia_ObjSetTravIdCurrent(p->pAig,pObj);
    iVar2 = Gia_ObjLevel(p->pAig,pObj);
    if (iVar2 <= LevelMin) break;
    if ((~*(uint *)pObj & 0x9fffffff) == 0) {
      return;
    }
    iVar2 = Cec_ObjSatNum(p,pObj);
    if (iVar2 != 0) {
      iVar3 = Gia_ObjLevel(p->pAig,pObj);
      psVar1 = p->pSat;
      psVar1->factors[iVar2] =
           (double)(((float)(iVar3 - LevelMin) * 20.0) / (float)(LevelMax - LevelMin));
      uVar4 = (psVar1->act_vars).size;
      if (uVar4 == (psVar1->act_vars).cap) {
        iVar3 = (uVar4 >> 1) * 3;
        if ((int)uVar4 < 4) {
          iVar3 = uVar4 * 2;
        }
        piVar5 = (psVar1->act_vars).ptr;
        if (piVar5 == (int *)0x0) {
          piVar5 = (int *)malloc((long)iVar3 << 2);
        }
        else {
          piVar5 = (int *)realloc(piVar5,(long)iVar3 << 2);
        }
        (psVar1->act_vars).ptr = piVar5;
        if (piVar5 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(psVar1->act_vars).cap * 9.5367431640625e-07,
                 (double)iVar3 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (psVar1->act_vars).cap = iVar3;
        uVar4 = (psVar1->act_vars).size;
      }
      (psVar1->act_vars).size = uVar4 + 1;
      (psVar1->act_vars).ptr[(int)uVar4] = iVar2;
    }
    Cec_SetActivityFactors_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff),LevelMin,LevelMax);
    pObj = pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  return;
}

Assistant:

void Cec_SetActivityFactors_rec( Cec_ManSat_t * p, Gia_Obj_t * pObj, int LevelMin, int LevelMax )
{
    float dActConeBumpMax = 20.0;
    int iVar;
    // skip visited variables
    if ( Gia_ObjIsTravIdCurrent(p->pAig, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p->pAig, pObj);
    // add the PI to the list
    if ( Gia_ObjLevel(p->pAig, pObj) <= LevelMin || Gia_ObjIsCi(pObj) )
        return;
    // set the factor of this variable
    // (LevelMax-LevelMin) / (pObj->Level-LevelMin) = p->pPars->dActConeBumpMax / ThisBump
    if ( (iVar = Cec_ObjSatNum(p,pObj)) )
    {
        p->pSat->factors[iVar] = dActConeBumpMax * (Gia_ObjLevel(p->pAig, pObj) - LevelMin)/(LevelMax - LevelMin);
        veci_push(&p->pSat->act_vars, iVar);
    }
    // explore the fanins
    Cec_SetActivityFactors_rec( p, Gia_ObjFanin0(pObj), LevelMin, LevelMax );
    Cec_SetActivityFactors_rec( p, Gia_ObjFanin1(pObj), LevelMin, LevelMax );
}